

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.cpp
# Opt level: O1

void setPagesRX(void *ptr,size_t bytes)

{
  int iVar1;
  runtime_error *this;
  
  iVar1 = mprotect(ptr,bytes,5);
  if (iVar1 != -1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"mprotect failed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline void pageProtect(void* ptr, std::size_t bytes, int rules) {
#if defined(_WIN32) || defined(__CYGWIN__)
	DWORD oldp;
	if (!VirtualProtect(ptr, bytes, (DWORD)rules, &oldp)) {
		throw std::runtime_error(getErrorMessage("VirtualProtect"));
	}
#else
	if (-1 == mprotect(ptr, bytes, rules))
		throw std::runtime_error("mprotect failed");
#endif
}